

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Sintatico::procedimento(Sintatico *this)

{
  eat(this,0x26);
  identificador(this);
  parametros_formais(this);
  eat(this,0x15);
  bloco(this);
  eat(this,0x15);
  return;
}

Assistant:

void Sintatico::procedimento() {
  eat(PROCEDURE);
  identificador();
  parametros_formais();
  eat(PONTOVIRGULA);
  bloco();
  eat(PONTOVIRGULA);
}